

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateMergeFromCodedStream
          (MessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_MESSAGE) {
    io::Printer::Print(printer,&this->variables_,
                       "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n     input, mutable_$name$()));\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n      $number$, input, mutable_$name$()));\n"
                      );
  }
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE) {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(\n"
      "     input, mutable_$name$()));\n");
  } else {
    printer->Print(variables_,
      "DO_(::google::protobuf::internal::WireFormatLite::ReadGroupNoVirtual(\n"
      "      $number$, input, mutable_$name$()));\n");
  }
}